

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue_p.h
# Opt level: O3

void __thiscall
QCborContainerPrivate::replaceAt_internal
          (QCborContainerPrivate *this,Element *e,QCborValue *value,ContainerDisposition disp)

{
  Type TVar1;
  uint uVar2;
  QCborContainerPrivate *pQVar3;
  Element *pEVar4;
  ValueFlags VVar5;
  qptrdiff qVar6;
  char *pcVar7;
  qsizetype *pqVar8;
  long in_FS_OFFSET;
  QByteArray QStack_58;
  long lStack_38;
  
  if (value->container == (QCborContainerPrivate *)0x0) {
    TVar1 = value->t;
    e->field_0 = (anon_union_8_2_4ee71171_for_Element_0)value->n;
    e->type = TVar1;
    (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 0;
    if ((value->t & 0xffffffdf) == Array) {
      (e->field_0).value = 0;
    }
    return;
  }
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = value->container;
  if (value->n < 0) {
    if (pQVar3 == this) {
      replaceAt_complex();
    }
    else {
      (e->field_0).container = pQVar3;
      if (disp == CopyContainer) {
        LOCK();
        (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int>._M_i =
             (pQVar3->super_QSharedData).ref.super_QAtomicInteger<int>.
             super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    e->type = value->t;
    (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = 1;
  }
  else {
    pEVar4 = (pQVar3->elements).d.ptr + value->n;
    TVar1 = pEVar4->type;
    VVar5.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
    super_QFlagsStorage<QtCbor::Element::ValueFlag>.i =
         (pEVar4->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>;
    e->field_0 = pEVar4->field_0;
    e->type = TVar1;
    e->flags = (ValueFlags)
               VVar5.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
               super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
    pcVar7 = (value->container->data).d.ptr;
    pEVar4 = (value->container->elements).d.ptr;
    if (pcVar7 == (char *)0x0) {
      pcVar7 = "";
    }
    if ((pEVar4[value->n].flags.super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
         super_QFlagsStorage<QtCbor::Element::ValueFlag>.i & 2) != 0) {
      pqVar8 = (qsizetype *)(pcVar7 + pEVar4[value->n].field_0.value);
      uVar2 = (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
              super_QFlagsStorage<QtCbor::Element::ValueFlag>.i;
      (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = uVar2 & 0xfffffffd;
      if (value->container == this) {
        QStack_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        QStack_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        QStack_58.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        QByteArray::QByteArray(&QStack_58,(char *)(pqVar8 + 1),*pqVar8);
        compact(this);
        pcVar7 = QStack_58.d.ptr;
        if (QStack_58.d.ptr == (char *)0x0) {
          pcVar7 = "";
        }
        qVar6 = addByteDataImpl(&this->data,&this->usedData,pcVar7,QStack_58.d.size);
        (e->field_0).value = qVar6;
        if (&(QStack_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((QStack_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((QStack_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((QStack_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(QStack_58.d.d)->super_QArrayData,1,0x10);
          }
        }
      }
      else {
        compact(this);
        qVar6 = addByteDataImpl(&this->data,&this->usedData,(char *)(pqVar8 + 1),*pqVar8);
        (e->field_0).value = qVar6;
      }
      (e->flags).super_QFlagsStorageHelper<QtCbor::Element::ValueFlag,_4>.
      super_QFlagsStorage<QtCbor::Element::ValueFlag>.i = uVar2;
    }
    if (disp == MoveContainer) {
      deref(value->container);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void replaceAt_internal(QtCbor::Element &e, const QCborValue &value, ContainerDisposition disp)
    {
        if (value.container)
            return replaceAt_complex(e, value, disp);

        e = { value.value_helper(), value.type() };
        if (value.isContainer())
            e.container = nullptr;
    }